

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = this->current_;
  while( true ) {
    if (pcVar2 == this->end_) {
      return true;
    }
    this->current_ = pcVar2 + 1;
    cVar1 = *pcVar2;
    if (cVar1 == '\r') break;
    pcVar2 = pcVar2 + 1;
    if (cVar1 == '\n') {
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\r' || c == '\n')
      break;
  }
  return true;
}